

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

char * corpus_utt(void)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  
  pcVar3 = cur_ctl_path;
  pcVar7 = cur_ctl_utt_id;
  if (((cur_ctl_utt_id == (char *)0x0) && (pcVar7 = "N/A", cur_ctl_path != (char *)0x0)) &&
     (sVar4 = strlen(cur_ctl_path), sVar4 != 0)) {
    lVar5 = (sVar4 << 0x20) + 0x100000000;
    lVar6 = (long)(int)sVar4;
    do {
      lVar5 = lVar5 + -0x100000000;
      lVar1 = lVar6 + -1;
      if (lVar6 < 2) break;
      lVar2 = lVar6 + -1;
      lVar6 = lVar1;
    } while (pcVar3[lVar2] != '/');
    pcVar7 = pcVar3;
    if (lVar1 != 0) {
      pcVar7 = pcVar3 + (lVar5 >> 0x20);
    }
  }
  return pcVar7;
}

Assistant:

char *corpus_utt()
{
    int need_slash = 1;
    int i;

    if (cur_ctl_utt_id)
	return cur_ctl_utt_id;
    else {
	if (cur_ctl_path && strlen(cur_ctl_path) > 0) {
	    i = strlen(cur_ctl_path);
	    do {
		if (cur_ctl_path[--i] == '/')
		    --need_slash;
	    } while ((i > 0) && need_slash);
	    
	    if (i == 0)
		return cur_ctl_path;
	    else
		return &cur_ctl_path[i+1];
	}
	else {
	    return "N/A";
	}
    }
}